

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void Memory::
     DeleteObject<Memory::NoThrowHeapAllocator,(Memory::AllocatorDeleteFlags)0,StackBackTrace>
               (AllocatorType *allocator,StackBackTrace *obj,size_t plusSize)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  long extraout_RDX;
  undefined8 *in_FS_OFFSET;
  code *local_48;
  FreeFuncType freeFunc;
  size_t plusSize_local;
  StackBackTrace *obj_local;
  AllocatorType *allocator_local;
  
  if (plusSize + 8 < 8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x130,"(sizeof(T) + plusSize >= sizeof(T))",
                       "sizeof(T) + plusSize >= sizeof(T)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  local_48 = (code *)TypeAllocatorFunc<Memory::NoThrowHeapAllocator,_StackBackTrace>::GetFreeFunc();
  if (((ulong)local_48 & 1) != 0) {
    local_48 = *(code **)(local_48 + *(long *)(allocator + extraout_RDX) + -1);
  }
  sVar3 = _AllocatorDelete<StackBackTrace,_(Memory::AllocatorDeleteFlags)0>::Size(plusSize);
  (*local_48)(allocator + extraout_RDX,obj,sVar3);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj, size_t plusSize)
{
    obj->~T();

    // DeleteObject can only be called when an object is allocated successfully.
    // So the add should never overflow
    Assert(sizeof(T) + plusSize >= sizeof(T));

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size(plusSize));
}